

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_named_unary_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos658;
  code *action;
  char *name;
  int yypos658;
  
  iVar7 = G->pos;
  iVar6 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  iVar5 = G->pos;
  iVar1 = G->thunkpos;
  yyDo(G,yy_1_named_unary_expr,G->begin,G->end,"yy_1_named_unary_expr");
  iVar3 = yymatchString(G,"my");
  if ((iVar3 == 0) || (iVar3 = yy_ws(G), iVar3 == 0)) {
LAB_00112820:
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yymatchString(G,"our");
    if ((iVar3 != 0) && (iVar3 = yy_ws(G), iVar3 != 0)) {
      do {
        iVar3 = G->pos;
        iVar2 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar2;
      iVar3 = yy_junctive_or_expr(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        iVar7 = G->begin;
        iVar6 = G->end;
        action = yy_3_named_unary_expr;
        name = "yy_3_named_unary_expr";
        goto LAB_00112979;
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar3 = yy_reserved(G);
    if (iVar3 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar1;
      iVar3 = yy_ident(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar3 = yy_ws(G);
        if (iVar3 != 0) {
          do {
            iVar3 = G->pos;
            iVar2 = G->thunkpos;
            iVar4 = yy_ws(G);
          } while (iVar4 != 0);
          G->pos = iVar3;
          G->thunkpos = iVar2;
          iVar3 = yy_bare_args(G);
          if (iVar3 != 0) {
            yyDo(G,yySet,-2,0,"yySet");
            iVar7 = G->begin;
            iVar6 = G->end;
            action = yy_4_named_unary_expr;
            name = "yy_4_named_unary_expr";
            goto LAB_00112979;
          }
        }
      }
    }
    G->pos = iVar5;
    G->thunkpos = iVar1;
    iVar5 = yy_junctive_or_expr(G);
    if (iVar5 == 0) {
      G->pos = iVar7;
      G->thunkpos = iVar6;
      return 0;
    }
  }
  else {
    do {
      iVar3 = G->pos;
      iVar2 = G->thunkpos;
      iVar4 = yy_ws(G);
    } while (iVar4 != 0);
    G->pos = iVar3;
    G->thunkpos = iVar2;
    iVar4 = yy_ident(G);
    if (iVar4 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar2;
    }
    else {
      yyDo(G,yySet,-3,0,"yySet");
    }
    do {
      iVar3 = G->pos;
      iVar2 = G->thunkpos;
      iVar4 = yy_ws(G);
    } while (iVar4 != 0);
    G->pos = iVar3;
    G->thunkpos = iVar2;
    iVar3 = yy_junctive_or_expr(G);
    if (iVar3 == 0) goto LAB_00112820;
    yyDo(G,yySet,-2,0,"yySet");
    iVar7 = G->begin;
    iVar6 = G->end;
    action = yy_2_named_unary_expr;
    name = "yy_2_named_unary_expr";
LAB_00112979:
    yyDo(G,action,iVar7,iVar6,name);
  }
  yyDo(G,yyPop,3,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_named_unary_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "named_unary_expr"));

  {  int yypos654= G->pos, yythunkpos654= G->thunkpos;  yyDo(G, yy_1_named_unary_expr, G->begin, G->end, "yy_1_named_unary_expr");
  if (!yymatchString(G, "my")) goto l655;
  if (!yy_ws(G))  goto l655;

  l656:;	
  {  int yypos657= G->pos, yythunkpos657= G->thunkpos;  if (!yy_ws(G))  goto l657;
  goto l656;
  l657:;	  G->pos= yypos657; G->thunkpos= yythunkpos657;
  }
  {  int yypos658= G->pos, yythunkpos658= G->thunkpos;  if (!yy_ident(G))  goto l658;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l659;
  l658:;	  G->pos= yypos658; G->thunkpos= yythunkpos658;
  }
  l659:;	  if (!yy__(G))  goto l655;
  if (!yy_junctive_or_expr(G))  goto l655;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_named_unary_expr, G->begin, G->end, "yy_2_named_unary_expr");
  goto l654;
  l655:;	  G->pos= yypos654; G->thunkpos= yythunkpos654;  if (!yymatchString(G, "our")) goto l660;
  if (!yy_ws(G))  goto l660;

  l661:;	
  {  int yypos662= G->pos, yythunkpos662= G->thunkpos;  if (!yy_ws(G))  goto l662;
  goto l661;
  l662:;	  G->pos= yypos662; G->thunkpos= yythunkpos662;
  }  if (!yy_junctive_or_expr(G))  goto l660;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_3_named_unary_expr, G->begin, G->end, "yy_3_named_unary_expr");
  goto l654;
  l660:;	  G->pos= yypos654; G->thunkpos= yythunkpos654;
  {  int yypos664= G->pos, yythunkpos664= G->thunkpos;  if (!yy_reserved(G))  goto l664;
  goto l663;
  l664:;	  G->pos= yypos664; G->thunkpos= yythunkpos664;
  }  if (!yy_ident(G))  goto l663;
  yyDo(G, yySet, -1, 0, "yySet");
  if (!yy_ws(G))  goto l663;

  l665:;	
  {  int yypos666= G->pos, yythunkpos666= G->thunkpos;  if (!yy_ws(G))  goto l666;
  goto l665;
  l666:;	  G->pos= yypos666; G->thunkpos= yythunkpos666;
  }  if (!yy_bare_args(G))  goto l663;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_4_named_unary_expr, G->begin, G->end, "yy_4_named_unary_expr");
  goto l654;
  l663:;	  G->pos= yypos654; G->thunkpos= yythunkpos654;  if (!yy_junctive_or_expr(G))  goto l653;

  }
  l654:;	  yyprintf((stderr, "  ok   named_unary_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l653:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "named_unary_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}